

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

int Hop_ObjRecognizeExor(Hop_Obj_t *pObj,Hop_Obj_t **ppFan0,Hop_Obj_t **ppFan1)

{
  Hop_Obj_t *pHVar1;
  uint uVar2;
  ulong uVar3;
  Hop_Obj_t **ppHVar4;
  ulong uVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopUtil.c"
                  ,0xbe,"int Hop_ObjRecognizeExor(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
  }
  if ((*(uint *)&pObj->field_0x20 & 6) != 4) {
    return 0;
  }
  uVar2 = *(uint *)&pObj->field_0x20 & 5;
  if (uVar2 == 4) {
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      return 0;
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      return 0;
    }
    uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if ((*(uint *)(uVar3 + 0x20) & 7) != 4) {
      return 0;
    }
    uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if ((*(uint *)(uVar5 + 0x20) & 7) != 4) {
      return 0;
    }
    pHVar1 = *(Hop_Obj_t **)(uVar3 + 0x10);
    if (1 < (*(ulong *)(uVar5 + 0x10) ^ (ulong)pHVar1)) {
      return 0;
    }
    if (1 < (*(ulong *)(uVar5 + 0x18) ^ *(ulong *)(uVar3 + 0x18))) {
      return 0;
    }
    if ((((uint)*(ulong *)(uVar5 + 0x10) ^ (uint)pHVar1) & 1) == 0) {
      return 0;
    }
    if ((((uint)*(ulong *)(uVar5 + 0x18) ^ (uint)*(ulong *)(uVar3 + 0x18)) & 1) == 0) {
      return 0;
    }
    ppHVar4 = (Hop_Obj_t **)(uVar3 + 0x18);
    *ppFan0 = pHVar1;
  }
  else {
    if (uVar2 != 5) {
      __assert_fail("Hop_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopUtil.c"
                    ,199,"int Hop_ObjRecognizeExor(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
    }
    *ppFan0 = pObj->pFanin0;
    ppHVar4 = &pObj->pFanin1;
  }
  *ppFan1 = *ppHVar4;
  return 1;
}

Assistant:

int Hop_ObjRecognizeExor( Hop_Obj_t * pObj, Hop_Obj_t ** ppFan0, Hop_Obj_t ** ppFan1 )
{
    Hop_Obj_t * p0, * p1;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) )
        return 0;
    if ( Hop_ObjIsExor(pObj) )
    {
        *ppFan0 = Hop_ObjChild0(pObj);
        *ppFan1 = Hop_ObjChild1(pObj);
        return 1;
    }
    assert( Hop_ObjIsAnd(pObj) );
    p0 = Hop_ObjChild0(pObj);
    p1 = Hop_ObjChild1(pObj);
    if ( !Hop_IsComplement(p0) || !Hop_IsComplement(p1) )
        return 0;
    p0 = Hop_Regular(p0);
    p1 = Hop_Regular(p1);
    if ( !Hop_ObjIsAnd(p0) || !Hop_ObjIsAnd(p1) )
        return 0;
    if ( Hop_ObjFanin0(p0) != Hop_ObjFanin0(p1) || Hop_ObjFanin1(p0) != Hop_ObjFanin1(p1) )
        return 0;
    if ( Hop_ObjFaninC0(p0) == Hop_ObjFaninC0(p1) || Hop_ObjFaninC1(p0) == Hop_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Hop_ObjChild0(p0);
    *ppFan1 = Hop_ObjChild1(p0);
    return 1;
}